

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O0

GLsizei deqp::gls::FboUtil::config::textureLayer(TextureAttachment *tAtt)

{
  long local_40;
  long local_30;
  TextureLayerAttachment *lAtt;
  TextureAttachment *tAtt_local;
  
  if (tAtt == (TextureAttachment *)0x0) {
    local_30 = 0;
  }
  else {
    local_30 = __dynamic_cast(tAtt,&TextureAttachment::typeinfo,&TextureFlatAttachment::typeinfo,0);
  }
  if (local_30 == 0) {
    if (tAtt == (TextureAttachment *)0x0) {
      local_40 = 0;
    }
    else {
      local_40 = __dynamic_cast(tAtt,&TextureAttachment::typeinfo,&TextureLayerAttachment::typeinfo,
                                0);
    }
    if (local_40 == 0) {
      tAtt_local._4_4_ = 0;
    }
    else {
      tAtt_local._4_4_ = *(GLsizei *)(local_40 + 0x14);
    }
  }
  else {
    tAtt_local._4_4_ = 0;
  }
  return tAtt_local._4_4_;
}

Assistant:

static GLsizei textureLayer (const TextureAttachment& tAtt)
{
	if (dynamic_cast<const TextureFlatAttachment*>(&tAtt) != DE_NULL)
		return 0;
	else if (const TextureLayerAttachment* const lAtt =
			 dynamic_cast<const TextureLayerAttachment*>(&tAtt))
		return lAtt->layer;

	DE_FATAL("Impossible attachment type");
	return 0;
}